

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall CLI::ValidationError::ValidationError(ValidationError *this,string *msg)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  ValidationError *unaff_retaddr;
  allocator<char> *in_stack_ffffffffffffffb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  allocator<char> local_31 [29];
  ExitCodes in_stack_ffffffffffffffec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *msg_00;
  
  msg_00 = in_RSI;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  ::std::__cxx11::string::string(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  ValidationError(unaff_retaddr,in_RDI,(string *)msg_00,in_stack_ffffffffffffffec);
  ::std::__cxx11::string::~string(in_RSI);
  ::std::__cxx11::string::~string(in_RSI);
  ::std::allocator<char>::~allocator(local_31);
  return;
}

Assistant:

explicit ValidationError(std::string name, std::string msg) : ValidationError(name + ": " + msg) {}